

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<std::complex<float>,_10>::Shrink(TPZManVector<std::complex<float>,_10> *this)

{
  ulong uVar1;
  complex<float> *pcVar2;
  ulong uVar3;
  complex<float> *pcVar4;
  int64_t i;
  
  uVar1 = (this->super_TPZVec<std::complex<float>_>).fNElements;
  if (10 < (long)uVar1) {
    if ((this->super_TPZVec<std::complex<float>_>).fNAlloc == uVar1) {
      return;
    }
    uVar3 = 0;
    pcVar4 = (complex<float> *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    memset(pcVar4,0,uVar1 * 8);
    pcVar2 = (this->super_TPZVec<std::complex<float>_>).fStore;
    do {
      pcVar4[uVar3]._M_value = pcVar2[uVar3]._M_value;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    operator_delete__(pcVar2);
    (this->super_TPZVec<std::complex<float>_>).fStore = pcVar4;
    (this->super_TPZVec<std::complex<float>_>).fNAlloc =
         (this->super_TPZVec<std::complex<float>_>).fNElements;
    return;
  }
  pcVar4 = (this->super_TPZVec<std::complex<float>_>).fStore;
  pcVar2 = this->fExtAlloc;
  if (pcVar4 == pcVar2) {
    return;
  }
  if ((long)uVar1 < 1) {
    if (pcVar4 == (complex<float> *)0x0) goto LAB_00d14b5a;
  }
  else {
    uVar3 = 0;
    do {
      pcVar2[uVar3]._M_value = pcVar4[uVar3]._M_value;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  operator_delete__(pcVar4);
LAB_00d14b5a:
  (this->super_TPZVec<std::complex<float>_>).fStore = pcVar2;
  (this->super_TPZVec<std::complex<float>_>).fNAlloc = 10;
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}